

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_sse41_128_64.c
# Opt level: O2

parasail_result_t *
parasail_sw_table_diag_sse41_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  int *piVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  parasail_result_t *ppVar7;
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  long lVar8;
  int64_t iVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  int iVar14;
  int64_t *piVar15;
  int iVar16;
  char *__format;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  uint extraout_XMM0_Da;
  uint extraout_XMM0_Da_00;
  undefined8 uVar21;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  uint extraout_XMM0_Dc;
  undefined1 auVar22 [16];
  undefined8 uVar28;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  uint extraout_XMM0_Dc_00;
  undefined8 extraout_XMM0_Qb_00;
  uint extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  undefined1 extraout_XMM0 [16];
  undefined8 extraout_XMM0_Qb_01;
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int64_t *piVar34;
  __m128i_64_t B_1;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  __m128i_64_t B;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 in_XMM6 [16];
  long lVar39;
  __m128i_64_t B_2;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  long lVar42;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i b_02;
  __m128i b_03;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i alVar43;
  __m128i alVar44;
  int iStack_224;
  int64_t *local_218;
  undefined1 local_208 [16];
  long local_1e8;
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  undefined1 local_1c8 [16];
  long lStack_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  long local_128 [2];
  undefined1 local_118 [16];
  long local_108;
  long local_100;
  ulong local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  long local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  int local_98;
  undefined4 uStack_94;
  int iStack_90;
  undefined4 uStack_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  long local_68;
  long lStack_60;
  long local_58;
  long lStack_50;
  undefined1 local_48 [16];
  longlong lVar13;
  long lVar29;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar12 = "_s2";
  }
  else if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar12 = "s2Len";
  }
  else if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar12 = "open";
  }
  else if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar12 = "gap";
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar12 = "matrix";
  }
  else {
    if (matrix->type != 0) {
      uVar11 = (ulong)(uint)matrix->length;
LAB_0065cb49:
      iVar16 = matrix->min;
      uVar17 = 0x8000000000000000 - (long)iVar16;
      if (iVar16 != -open && SBORROW4(iVar16,-open) == iVar16 + open < 0) {
        uVar17 = (ulong)(uint)open | 0x8000000000000000;
      }
      piVar15 = (int64_t *)(uVar17 + 1);
      iVar16 = matrix->max;
      auVar22._8_4_ = (int)piVar15;
      auVar22._0_8_ = piVar15;
      auVar22._12_4_ = (int)((ulong)piVar15 >> 0x20);
      iVar14 = (int)uVar11;
      local_168 = auVar22;
      local_118 = auVar22;
      ppVar7 = parasail_result_new_table1(iVar14,s2Len);
      if (ppVar7 != (parasail_result_t *)0x0) {
        ppVar7->flag = ppVar7->flag | 0x2821004;
        uVar18 = (ulong)(s2Len + 2);
        ptr = parasail_memalign_int64_t(0x10,uVar18);
        ptr_00 = parasail_memalign_int64_t(0x10,uVar18);
        uVar17 = 0x10;
        ptr_01 = parasail_memalign_int64_t(0x10,uVar18);
        if (ptr_01 != (int64_t *)0x0 && (ptr_00 != (int64_t *)0x0 && ptr != (int64_t *)0x0)) {
          lVar8 = (long)iVar14;
          if (matrix->type == 0) {
            local_218 = parasail_memalign_int64_t(0x10,(long)(iVar14 + 1));
            uVar17 = 0;
            if (local_218 == (int64_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            uVar18 = 0;
            if (0 < iVar14) {
              uVar18 = uVar11;
            }
            for (; lVar19 = lVar8, uVar18 != uVar17; uVar17 = uVar17 + 1) {
              local_218[uVar17] = (long)matrix->mapper[(byte)_s1[uVar17]];
            }
            for (; lVar19 <= lVar8; lVar19 = lVar19 + 1) {
              local_218[lVar19] = 0;
            }
          }
          else {
            local_218 = (int64_t *)0x0;
          }
          lVar19 = 0x7ffffffffffffffe - (long)iVar16;
          local_e8._8_4_ = (int)lVar19;
          local_e8._0_8_ = lVar19;
          local_e8._12_4_ = (int)((ulong)lVar19 >> 0x20);
          lStack_1b0 = auVar22._8_8_;
          local_c8 = lStack_1b0;
          uStack_c0 = 0;
          local_98 = open;
          uStack_94 = 0;
          iStack_90 = open;
          uStack_8c = 0;
          local_a8._4_4_ = 0;
          local_a8._0_4_ = gap;
          local_a8._8_4_ = gap;
          local_a8._12_4_ = 0;
          iStack_224 = iVar14 >> 0x1f;
          local_d8 = iVar14;
          iStack_d4 = iStack_224;
          iStack_d0 = iVar14;
          iStack_cc = iStack_224;
          uVar18 = (ulong)(uint)s2Len;
          local_b8._4_4_ = 0;
          local_b8._0_4_ = s2Len;
          local_b8._8_4_ = s2Len;
          local_b8._12_4_ = 0;
          piVar1 = matrix->mapper;
          for (uVar11 = 0; uVar18 != uVar11; uVar11 = uVar11 + 1) {
            ptr[uVar11 + 1] = (long)piVar1[(byte)_s2[uVar11]];
          }
          *ptr = 0;
          for (uVar11 = uVar18; (int)uVar11 <= s2Len; uVar11 = uVar11 + 1) {
            ptr[uVar11 + 1] = 0;
          }
          for (uVar11 = 0; uVar18 != uVar11; uVar11 = uVar11 + 1) {
            ptr_00[uVar11 + 1] = 0;
            ptr_01[uVar11 + 1] = (int64_t)piVar15;
          }
          *ptr_00 = (int64_t)piVar15;
          *ptr_01 = (int64_t)piVar15;
          for (uVar11 = uVar18; (int)uVar11 <= s2Len; uVar11 = uVar11 + 1) {
            ptr_00[uVar11 + 1] = (int64_t)piVar15;
            ptr_01[uVar11 + 1] = (int64_t)piVar15;
          }
          local_100 = uVar18 * 8;
          local_108 = uVar18 * 4;
          local_178._0_12_ = ZEXT812(1);
          local_178._12_4_ = 0;
          local_1e8 = 0;
          local_1c8._8_8_ = lStack_1b0;
          local_1c8._0_8_ = piVar15;
          local_208._8_8_ = lStack_1b0;
          local_208._0_8_ = piVar15;
          local_138._8_8_ = lStack_1b0;
          local_138._0_8_ = piVar15;
          local_148._8_8_ = lStack_1b0;
          local_148._0_8_ = piVar15;
          local_158 = local_e8;
          uVar11 = 0;
          b[1] = ptr_00;
          a[1] = ptr;
          lVar19 = local_118._0_8_;
          lVar10 = local_118._8_8_;
          uVar21 = local_168._0_8_;
          uVar28 = local_168._8_8_;
          while ((long)uVar11 < lVar8) {
            if (matrix->type == 0) {
              uVar20 = local_218[uVar11];
              iVar9 = local_218[uVar11 + 1];
            }
            else {
              uVar6 = iVar14 - 1;
              if ((long)(uVar11 | 1) < lVar8) {
                uVar6 = (uint)uVar11 | 1;
              }
              iVar9 = (int64_t)(int)uVar6;
              uVar20 = uVar11;
            }
            piVar1 = matrix->matrix;
            a[1] = (int64_t *)(long)matrix->size;
            alVar44[1] = (int64_t *)(uVar20 * (long)a[1]);
            lVar10 = iVar9 * (long)a[1];
            alVar44[0] = (longlong)piVar1;
            a[0] = uVar17;
            b[1] = alVar44[1];
            local_f8 = uVar11;
            alVar43 = _mm_cmplt_epi64_rpl(a,alVar44);
            lVar13 = alVar43[1];
            local_88 = extraout_XMM0_Qa;
            uStack_80 = extraout_XMM0_Qb;
            local_f0 = local_108 * (uVar11 | 1);
            uVar20 = 0;
            auVar30._8_8_ = uStack_c0;
            auVar30._0_8_ = local_c8;
            local_1a8._8_8_ = lStack_1b0;
            local_1a8._0_8_ = piVar15;
            in_XMM6 = pmovsxbq(in_XMM6,0xff);
            auVar41 = auVar30;
            piVar34 = piVar15;
            lVar19 = lStack_1b0;
            while( true ) {
              if (uVar18 < uVar20) break;
              local_58 = auVar41._8_8_;
              lStack_50 = ptr_00[uVar20 + 1];
              auVar38._0_8_ = local_58 - CONCAT44(uStack_94,local_98);
              auVar38._8_8_ = lStack_50 - CONCAT44(uStack_8c,iStack_90);
              auVar37._0_8_ = local_1a8._8_8_ - local_a8._0_8_;
              auVar37._8_8_ = ptr_01[uVar20 + 1] - local_a8._8_8_;
              auVar40._0_8_ = auVar41._0_8_ - CONCAT44(uStack_94,local_98);
              auVar40._8_8_ = local_58 - CONCAT44(uStack_8c,iStack_90);
              auVar35._0_8_ = (long)piVar34 - local_a8._0_8_;
              auVar35._8_8_ = lVar19 - local_a8._8_8_;
              lVar19 = (long)piVar1[(long)alVar44[1] + ptr[uVar20 + 1]];
              auVar41._0_8_ = -(ulong)(auVar37._0_8_ < auVar38._0_8_);
              auVar41._8_8_ = -(ulong)(auVar37._8_8_ < auVar38._8_8_);
              auVar38 = blendvpd(auVar37,auVar38,auVar41);
              auVar33._0_8_ = (long)piVar1[lVar10 + ptr[uVar20]] + auVar30._0_8_;
              auVar33._8_8_ = lVar19 + auVar30._8_8_;
              auVar36._0_8_ = -(ulong)(auVar35._0_8_ < auVar40._0_8_);
              auVar36._8_8_ = -(ulong)(auVar35._8_8_ < auVar40._8_8_);
              auVar36 = blendvpd(auVar35,auVar40,auVar36);
              auVar23._0_8_ = -(ulong)(auVar36._0_8_ < auVar33._0_8_);
              auVar23._8_8_ = -(ulong)(auVar36._8_8_ < auVar33._8_8_);
              auVar30 = blendvpd(auVar36,auVar33,auVar23);
              auVar24._0_8_ = -(ulong)(auVar38._0_8_ < auVar30._0_8_);
              auVar24._8_8_ = -(ulong)(auVar38._8_8_ < auVar30._8_8_);
              auVar30 = blendvpd(auVar38,auVar30,auVar24);
              auVar31._0_8_ = -(ulong)(0 < auVar30._0_8_);
              auVar31._8_8_ = -(ulong)(0 < auVar30._8_8_);
              lVar29 = in_XMM6._8_8_;
              auVar25._0_8_ = -(ulong)(in_XMM6._0_8_ == -1);
              auVar25._8_8_ = -(ulong)(lVar29 == -1);
              auVar41 = ~auVar25 & auVar31 & auVar30;
              local_1a8 = blendvpd(auVar38,auVar22,auVar25);
              local_48 = blendvpd(auVar36,auVar22,auVar25);
              lVar39 = auVar41._0_8_;
              lVar42 = auVar41._8_8_;
              if (1 < uVar20) {
                auVar26._0_8_ = -(ulong)(local_158._0_8_ < lVar39);
                auVar26._8_8_ = -(ulong)(local_158._8_8_ < lVar42);
                local_158 = blendvpd(auVar41,local_158,auVar26);
                auVar27._0_8_ = -(ulong)(lVar39 < local_148._0_8_);
                auVar27._8_8_ = -(ulong)(lVar42 < local_148._8_8_);
                local_148 = blendvpd(auVar41,local_148,auVar27);
              }
              piVar2 = ((ppVar7->field_4).rowcols)->score_row;
              if (uVar20 < uVar18) {
                lVar19 = local_1e8 + (long)piVar2;
                *(int *)(lVar19 + uVar20 * 4) = auVar41._8_4_;
              }
              bVar3 = lVar8 <= (long)(uVar11 | 1);
              b[1] = (int64_t *)CONCAT71((int7)((ulong)lVar19 >> 8),bVar3);
              b[0]._1_7_ = (undefined7)((ulong)lVar13 >> 8);
              b[0]._0_1_ = uVar20 == 0 || bVar3;
              if (uVar20 != 0 && !bVar3) {
                *(int *)((long)piVar2 + uVar20 * 4 + local_f0 + -4) = auVar41._0_4_;
              }
              ptr_00[uVar20] = lVar39;
              ptr_01[uVar20] = local_1a8._0_8_;
              a_00[1] = (longlong)a[1];
              a_00[0] = uVar17;
              alVar43 = _mm_cmpgt_epi64_rpl(a_00,b);
              alVar43[0] = alVar43[1];
              local_1d8 = (uint)extraout_XMM0_Qa_00;
              uStack_1d4 = (uint)((ulong)extraout_XMM0_Qa_00 >> 0x20);
              uStack_1d0 = (uint)extraout_XMM0_Qb_00;
              uStack_1cc = (uint)((ulong)extraout_XMM0_Qb_00 >> 0x20);
              alVar43[1] = (longlong)b[1];
              a_01[1] = (longlong)a[1];
              a_01[0] = uVar17;
              alVar43 = _mm_cmplt_epi64_rpl(a_01,alVar43);
              b_00[0] = alVar43[1];
              local_1d8 = extraout_XMM0_Da & (uint)local_88 & local_1d8;
              uStack_1d4 = extraout_XMM0_Db & local_88._4_4_ & uStack_1d4;
              uStack_1d0 = extraout_XMM0_Dc & (uint)uStack_80 & uStack_1d0;
              uStack_1cc = extraout_XMM0_Dd & uStack_80._4_4_ & uStack_1cc;
              local_68 = -(ulong)(lVar39 == local_208._0_8_);
              lStack_60 = -(ulong)(lVar42 == local_208._8_8_);
              b_00[1] = (longlong)b[1];
              a_02[1] = (longlong)a[1];
              a_02[0] = uVar17;
              alVar43 = _mm_cmpgt_epi64_rpl(a_02,b_00);
              b_01[0] = alVar43[1];
              local_78 = extraout_XMM0_Da_00 & local_1d8;
              uStack_74 = extraout_XMM0_Db_00 & uStack_1d4;
              uStack_70 = extraout_XMM0_Dc_00 & uStack_1d0;
              uStack_6c = extraout_XMM0_Dd_00 & uStack_1cc;
              b_01[1] = (longlong)b[1];
              a_03[1] = (longlong)a[1];
              a_03[0] = uVar17;
              alVar43 = _mm_cmplt_epi64_rpl(a_03,b_01);
              lVar13 = alVar43[1];
              auVar5._4_4_ = uStack_74;
              auVar5._0_4_ = local_78;
              auVar5._8_4_ = uStack_70;
              auVar5._12_4_ = uStack_6c;
              local_208 = pblendvb(local_208,auVar41,auVar5);
              auVar30 = pblendvb(local_138,local_178,auVar5);
              auVar36 = pblendvb(local_1c8,in_XMM6,auVar5);
              auVar4._4_4_ = uStack_1d4;
              auVar4._0_4_ = local_1d8;
              auVar4._8_4_ = uStack_1d0;
              auVar4._12_4_ = uStack_1cc;
              auVar32._8_8_ = lStack_60;
              auVar32._0_8_ = local_68;
              auVar32 = extraout_XMM0 & auVar4 & auVar32;
              local_138 = pblendvb(auVar30,local_178,auVar32);
              local_1c8 = pblendvb(auVar36,in_XMM6,auVar32);
              in_XMM6._0_8_ = in_XMM6._0_8_ + 1;
              in_XMM6._8_8_ = lVar29 + 1;
              uVar20 = uVar20 + 1;
              auVar30._8_8_ = lStack_50;
              auVar30._0_8_ = local_58;
              piVar34 = (int64_t *)local_48._0_8_;
              lVar19 = local_48._8_8_;
            }
            local_178._8_8_ = local_178._8_8_ + 2;
            local_178._0_8_ = local_178._0_8_ + 2;
            local_1e8 = local_1e8 + local_100;
            lVar19 = local_208._0_8_;
            lVar10 = local_208._8_8_;
            uVar21 = local_1c8._0_8_;
            uVar28 = local_1c8._8_8_;
            uVar11 = local_f8 + 2;
          }
          local_118._8_8_ = lVar10;
          local_118._0_8_ = lVar19;
          local_168._8_8_ = uVar28;
          local_168._0_8_ = uVar21;
          local_128[0] = local_138._0_8_;
          local_128[1] = local_138._8_8_;
          iVar14 = 0;
          iVar16 = 0;
          for (lVar8 = 0; (int)lVar8 != 2; lVar8 = lVar8 + 1) {
            b[1] = *(int64_t **)(local_118 + lVar8 * 8);
            if ((long)piVar15 < (long)b[1]) {
              iVar16 = (int)local_128[lVar8];
              piVar15 = b[1];
              iVar14 = *(int *)(local_168 + lVar8 * 8);
            }
            else if (b[1] == piVar15) {
              uVar11 = *(ulong *)(local_168 + lVar8 * 8);
              if ((long)uVar11 < (long)iVar14) {
                iVar16 = (int)local_128[lVar8];
                iVar14 = (int)uVar11;
              }
              else if ((uVar11 == (long)iVar14) &&
                      (a[1] = (int64_t *)local_128[lVar8], (long)a[1] < (long)iVar16)) {
                iVar16 = (int)a[1];
                iVar14 = (int)uVar11;
              }
            }
            b[1] = piVar15;
          }
          b_02[1] = (longlong)b[1];
          b_02[0] = uVar11;
          a_04[1] = (longlong)a[1];
          a_04[0] = uVar17;
          alVar44 = _mm_cmplt_epi64_rpl(a_04,b_02);
          b_03[0] = alVar44[1];
          local_208._8_8_ = extraout_XMM0_Qb_01;
          local_208._0_8_ = extraout_XMM0_Qa_01;
          b_03[1] = (longlong)b[1];
          a_05[1] = (longlong)a[1];
          a_05[0] = uVar17;
          _mm_cmpgt_epi64_rpl(a_05,b_03);
          local_208 = extraout_XMM0_00 | local_208;
          if ((((((((((((((((local_208 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (local_208 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (local_208 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (local_208 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (local_208 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (local_208 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (local_208 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (local_208 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (local_208 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (local_208 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (local_208 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (local_208 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (local_208 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (local_208 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (local_208 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              local_208[0xf] < '\0') {
            *(byte *)&ppVar7->flag = (byte)ppVar7->flag | 0x40;
            piVar15 = (int64_t *)0x0;
            iVar14 = 0;
            iVar16 = 0;
          }
          ppVar7->score = (int)piVar15;
          ppVar7->end_query = iVar16;
          ppVar7->end_ref = iVar14;
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          if (matrix->type == 0) {
            parasail_free(local_218);
            return ppVar7;
          }
          return ppVar7;
        }
      }
      return (parasail_result_t *)0x0;
    }
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar12 = "_s1";
    }
    else {
      uVar11 = (ulong)(uint)_s1Len;
      if (0 < _s1Len) goto LAB_0065cb49;
      __format = "%s: %s must be > 0\n";
      pcVar12 = "_s1Len";
    }
  }
  fprintf(_stderr,__format,"parasail_sw_table_diag_sse41_128_64",pcVar12);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 8); /* shift in a 0 */
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_set1_epi64x_rpl(0);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int64_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf0;
        __m128i vWH = vNegInf0;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        __m128i vIltLimit = _mm_cmplt_epi64_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vF = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vNH, vOpen),
                    _mm_sub_epi64(vF, vGap));
            vE = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vWH, vOpen),
                    _mm_sub_epi64(vE, vGap));
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            vWH = _mm_max_epi64_rpl(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi64_rpl(vJ, vNegOne),
                        _mm_cmplt_epi64_rpl(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi64(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi64_rpl(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi64_rpl(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
    }

    /* alignment ending position */
    {
        int64_t *t = (int64_t*)&vMaxH;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}